

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O3

int sprkStep_Reset(ARKodeMem ark_mem,sunrealtype tR,N_Vector yR)

{
  int iVar1;
  
  if (ark_mem->step_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,0x2e8,"sprkStep_Reset",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    N_VConst(0,*(undefined8 *)((long)ark_mem->step_mem + 0x18));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int sprkStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                           ARKodeSPRKStepMem* step_mem)
{
  /* access ARKodeSPRKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_SPRKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *step_mem = (ARKodeSPRKStepMem)ark_mem->step_mem;
  return (ARK_SUCCESS);
}